

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::optional(optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *v)

{
  long lVar1;
  
  this->set = v->set;
  if (v->set == true) {
    *(undefined4 *)&this->optionalValue = *(undefined4 *)&v->optionalValue;
    *(undefined1 **)((long)&this->optionalValue + 8) =
         (undefined1 *)((long)&this->optionalValue + 0x18);
    lVar1 = *(long *)((long)&v->optionalValue + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&this->optionalValue + 8),lVar1,
               *(long *)((long)&v->optionalValue + 0x10) + lVar1);
    return;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    bool has_value() const { return set; }